

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

bool jbcoin::amountFromJsonNoThrow(STAmount *result,Value *jvSource)

{
  STAmount local_190 [5];
  
  amountFromJson(local_190,(SField *)sfGeneric,jvSource);
  if (((result->super_STBase).fName)->fieldCode < 1) {
    (result->super_STBase).fName = local_190[0].super_STBase.fName;
  }
  (result->mIssue).currency.pn[4] = local_190[0].mIssue.currency.pn[4];
  *(undefined8 *)(result->mIssue).currency.pn = local_190[0].mIssue.currency.pn._0_8_;
  *(undefined8 *)((result->mIssue).currency.pn + 2) = local_190[0].mIssue.currency.pn._8_8_;
  *(undefined8 *)(result->mIssue).account.pn = local_190[0].mIssue.account.pn._0_8_;
  *(undefined8 *)((result->mIssue).account.pn + 2) = local_190[0].mIssue.account.pn._8_8_;
  (result->mIssue).account.pn[4] = local_190[0].mIssue.account.pn[4];
  result->mValue = CONCAT26(local_190[0].mValue._6_2_,(undefined6)local_190[0].mValue);
  *(ulong *)((long)&result->mValue + 6) = CONCAT62(local_190[0]._64_6_,local_190[0].mValue._6_2_);
  return true;
}

Assistant:

bool
amountFromJsonNoThrow (STAmount& result, Json::Value const& jvSource)
{
    try
    {
        result = amountFromJson (sfGeneric, jvSource);
        return true;
    }
    catch (const std::exception& e)
    {
        JLOG (debugLog().warn()) <<
            "amountFromJsonNoThrow: caught: " << e.what ();
    }
    return false;
}